

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O0

tuple<int,_int>
check_paths_and_choose_tuple
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *mtrx)

{
  pointer *ppdVar1;
  size_t *psVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference pdVar7;
  iterator __first;
  mapped_type *pmVar8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  double dVar9;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1e8;
  _Rb_tree_color local_1c8;
  int local_1c4;
  pair<int,_int> local_1c0;
  pair<int,_int> pair;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_1a8;
  double *local_1a0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_198;
  const_iterator local_190;
  double *local_180;
  double *local_178;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_170;
  const_iterator local_168;
  double *local_160;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_158;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_150;
  const_iterator local_148;
  int local_13c;
  iterator iStack_138;
  int l;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_130;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_128;
  double *local_120;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_118;
  const_iterator local_110;
  double *local_100;
  double *local_f8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_f0;
  const_iterator local_e8;
  double *local_e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d0;
  const_iterator local_c8;
  int local_ac;
  int local_a8;
  int k;
  int j;
  int i;
  double buff2;
  double buff1;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> path;
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  tmp;
  vector<double,_std::allocator<double>_> vec2;
  vector<double,_std::allocator<double>_> vec1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *mtrx_local;
  tuple<int,_int> *pas;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::map((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
         *)&path.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff1);
  std::tuple<int,_int>::tuple<true,_true>((tuple<int,_int> *)mtrx);
  k = 0;
  while( true ) {
    uVar3 = (ulong)k;
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(in_RSI);
    if (sVar4 <= uVar3) break;
    local_a8 = 0;
    while( true ) {
      uVar3 = (ulong)local_a8;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RSI,(long)k);
      sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
      if (sVar4 <= uVar3) break;
      pvVar5 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](in_RSI,(long)k);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_a8);
      if ((*pvVar6 == 0.0) && (!NAN(*pvVar6))) {
        local_ac = 0;
        while( true ) {
          uVar3 = (ulong)local_ac;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RSI,(long)k);
          sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar5);
          if (sVar4 <= uVar3) break;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RSI,(long)k);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_ac);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,pvVar6);
          local_ac = local_ac + 1;
        }
        ppdVar1 = &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_d8._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
        local_d0 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator+(&local_d8,(long)local_a8);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_c8,&local_d0);
        local_e0 = (double *)
                   std::vector<double,_std::allocator<double>_>::erase
                             ((vector<double,_std::allocator<double>_> *)ppdVar1,local_c8);
        local_f8 = (double *)
                   std::begin<std::vector<double,std::allocator<double>>>
                             ((vector<double,_std::allocator<double>_> *)
                              &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
        local_100 = (double *)
                    std::end<std::vector<double,std::allocator<double>>>
                              ((vector<double,_std::allocator<double>_> *)
                               &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
        local_f0 = std::
                   remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_paths_and_choose_tuple(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&)::__0>
                             (local_f8,local_100);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_e8,&local_f0);
        local_118._M_current =
             (double *)
             std::end<std::vector<double,std::allocator<double>>>
                       ((vector<double,_std::allocator<double>_> *)
                        &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_110,&local_118);
        local_120 = (double *)
                    std::vector<double,_std::allocator<double>_>::erase
                              ((vector<double,_std::allocator<double>_> *)
                               &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_e8,local_110);
        ppdVar1 = &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        local_130._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)ppdVar1);
        iStack_138 = std::vector<double,_std::allocator<double>_>::end
                               ((vector<double,_std::allocator<double>_> *)ppdVar1);
        local_128 = std::
                    min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                              (local_130,iStack_138._M_current);
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&local_128);
        buff2 = *pdVar7;
        local_13c = 0;
        while( true ) {
          uVar3 = (ulong)local_13c;
          sVar4 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size(in_RSI);
          if (sVar4 <= uVar3) break;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](in_RSI,(long)local_13c);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_a8);
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar6);
          local_13c = local_13c + 1;
        }
        psVar2 = &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_158._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)psVar2);
        local_150 = __gnu_cxx::
                    __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                    operator+(&local_158,(long)k);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_148,&local_150);
        local_160 = (double *)
                    std::vector<double,_std::allocator<double>_>::erase
                              ((vector<double,_std::allocator<double>_> *)psVar2,local_148);
        local_178 = (double *)
                    std::begin<std::vector<double,std::allocator<double>>>
                              ((vector<double,_std::allocator<double>_> *)
                               &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_180 = (double *)
                    std::end<std::vector<double,std::allocator<double>>>
                              ((vector<double,_std::allocator<double>_> *)
                               &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_170 = std::
                    remove_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_paths_and_choose_tuple(std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>&)::__1>
                              (local_178,local_180);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_168,&local_170);
        local_198._M_current =
             (double *)
             std::end<std::vector<double,std::allocator<double>>>
                       ((vector<double,_std::allocator<double>_> *)
                        &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_190,&local_198);
        local_1a0 = (double *)
                    std::vector<double,_std::allocator<double>_>::erase
                              ((vector<double,_std::allocator<double>_> *)
                               &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count,local_168,
                               local_190);
        psVar2 = &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __first = std::vector<double,_std::allocator<double>_>::begin
                            ((vector<double,_std::allocator<double>_> *)psVar2);
        pair = (pair<int,_int>)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)psVar2);
        local_1a8 = std::
                    min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                              (__first._M_current,
                               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                )pair);
        pdVar7 = __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&stack0xfffffffffffffe58);
        _j = *pdVar7;
        local_1c4 = k + 1;
        local_1c8 = local_a8 + _S_black;
        local_1c0 = std::make_pair<int,int>
                              (&stack0xfffffffffffffe3c,(int *)&stack0xfffffffffffffe38);
        dVar9 = buff2 + _j;
        pmVar8 = std::
                 map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                 ::operator[]((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                               *)&path.
                                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              &stack0xfffffffffffffe40);
        *pmVar8 = dVar9;
      }
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)
                 &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::clear
                ((vector<double,_std::allocator<double>_> *)
                 &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      local_a8 = local_a8 + 1;
    }
    k = k + 1;
  }
  findMaxValue_in_map((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
                       *)&stack0xfffffffffffffe30);
  std::tuple<int,_int>::operator=((tuple<int,_int> *)mtrx,(type)&stack0xfffffffffffffe30);
  reduce_rows_cols(&local_1e8,in_RSI,(tuple<int,_int> *)mtrx);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_1e8);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)&buff1);
  std::
  map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
  ::~map((map<std::pair<int,_int>,_double,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>_>
          *)&path.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &tmp._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &vec2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (tuple<int,_int>)(_Tuple_impl<0UL,_int,_int>)mtrx;
}

Assistant:

std::tuple<int,int> check_paths_and_choose_tuple(std::vector<std::vector<double>> &mtrx){

    std::vector<double> vec1,vec2;
    std::map<std::pair<int,int>,double> tmp;
    std::vector<std::tuple<int,int>> path;
    std::tuple<int,int> pas;

    double buff1,buff2;
    for (int i=0; i<mtrx.size();i++){
        for(int j=0; j<mtrx[i].size();j++) {
            if (mtrx[i][j] == 0) {
                for (int k = 0; k < mtrx[i].size(); k++) {
                    vec1.push_back(mtrx[i][k]);
                }
                vec1.erase(vec1.begin() + j);
                vec1.erase(std::remove_if(std::begin(vec1),std::end(vec1), [](const auto& value) {return std::isnan(value);}),std::end(vec1));
                buff1 = *std::min_element(vec1.begin(),vec1.end());
                for(int l =0; l<mtrx.size(); l++){
                    vec2.push_back(mtrx[l][j]);
                }
                vec2.erase(vec2.begin()+ i);
                vec2.erase(std::remove_if(std::begin(vec2),std::end(vec2), [](const auto& value) {return std::isnan(value);}),std::end(vec2));
                buff2 = *std::min_element(vec2.begin(),vec2.end());
                auto pair = std::make_pair(i+1,j+1);
                tmp[pair] = buff1+buff2;
            }
            vec1.clear();
            vec2.clear();
        }
    }


    pas = findMaxValue_in_map(tmp);
    reduce_rows_cols(mtrx,pas);


    return pas;
}